

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O2

bool __thiscall
QAbstractScrollAreaPrivate::canStartScrollingAt(QAbstractScrollAreaPrivate *this,QPoint *startPos)

{
  QWidget *object;
  QAbstractSlider *pQVar1;
  
  object = QWidget::childAt(*(QWidget **)
                             (*(long *)(*(long *)&(this->super_QFramePrivate).super_QWidgetPrivate.
                                                  field_0x8 + 8) + 0x2b0),startPos);
  pQVar1 = QtPrivate::qobject_cast_helper<QAbstractSlider*,QObject>(&object->super_QObject);
  return pQVar1 == (QAbstractSlider *)0x0;
}

Assistant:

bool QAbstractScrollAreaPrivate::canStartScrollingAt(const QPoint &startPos) const
{
    Q_Q(const QAbstractScrollArea);

    // don't start scrolling on a QAbstractSlider
    if (qobject_cast<QAbstractSlider *>(q->viewport()->childAt(startPos)))
        return false;

    return true;
}